

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

Var Js::JavascriptNumber::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Var aValue;
  Var pvVar7;
  JavascriptNumberObject *pJVar8;
  RecyclableObject *constructor;
  RecyclableObject *obj;
  undefined4 uVar9;
  undefined4 uVar10;
  int in_stack_00000010;
  Arguments local_58;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x16f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b8a97a;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_48,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((callInfo_local._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x176,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar4) {
LAB_00b8a97a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  aValue = Arguments::GetNewTarget((Arguments *)&callInfo_local);
  bVar4 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_58);
  if ((callInfo_local._0_4_ & 0xfffffe) == 0) {
    pJVar8 = (JavascriptNumberObject *)&DAT_1000000000000;
  }
  else {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    bVar5 = TaggedInt::Is(pvVar7);
    if ((bVar5) ||
       (pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1), (ulong)pvVar7 >> 0x32 != 0))
    {
      pJVar8 = (JavascriptNumberObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
    }
    else {
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      bVar5 = VarIs<Js::JavascriptNumberObject>(pvVar7);
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      if (bVar5) {
        pJVar8 = VarTo<Js::JavascriptNumberObject>(pvVar7);
        dVar3 = JavascriptNumberObject::GetValue(pJVar8);
        uVar9 = SUB84(dVar3,0);
        uVar10 = (undefined4)((ulong)dVar3 >> 0x20);
      }
      else {
        dVar3 = JavascriptConversion::ToNumber(pvVar7,pSVar1);
        uVar9 = SUB84(dVar3,0);
        uVar10 = (undefined4)((ulong)dVar3 >> 0x20);
      }
      pJVar8 = (JavascriptNumberObject *)ToVar((double)CONCAT44(uVar10,uVar9));
    }
  }
  if (((ulong)local_48 & 0x1000000) != 0) {
    pJVar8 = JavascriptLibrary::CreateNumberObject
                       ((pSVar1->super_ScriptContextBase).javascriptLibrary,pJVar8);
  }
  if (bVar4) {
    constructor = VarTo<Js::RecyclableObject>(aValue);
    obj = VarTo<Js::RecyclableObject>(pJVar8);
    pJVar8 = (JavascriptNumberObject *)
             JavascriptOperators::OrdinaryCreateFromConstructor
                       (constructor,obj,(DynamicObject *)0x0,pSVar1);
  }
  return pJVar8;
}

Assistant:

Var JavascriptNumber::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        //
        // Determine if called as a constructor or a function.
        //

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        Var result;

        if (args.Info.Count > 1)
        {
            if (TaggedInt::Is(args[1]) || JavascriptNumber::Is(args[1]))
            {
                result = args[1];
            }
            else if (VarIs<JavascriptNumberObject>(args[1]))
            {
                result = JavascriptNumber::ToVarNoCheck(VarTo<JavascriptNumberObject>(args[1])->GetValue(), scriptContext);
            }
            else
            {
                result = JavascriptNumber::ToVarNoCheck(JavascriptConversion::ToNumber(args[1], scriptContext), scriptContext);
            }
        }
        else
        {
            result = TaggedInt::ToVarUnchecked(0);
        }

        if (callInfo.Flags & CallFlags_New)
        {
            JavascriptNumberObject* obj = scriptContext->GetLibrary()->CreateNumberObject(result);
            result = obj;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), VarTo<RecyclableObject>(result), nullptr, scriptContext) :
            result;
    }